

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messagepattern.cpp
# Opt level: O2

int32_t __thiscall
icu_63::MessagePattern::parseSimpleStyle
          (MessagePattern *this,int32_t index,UParseError *parseError,UErrorCode *errorCode)

{
  short sVar1;
  char16_t cVar2;
  int iVar3;
  int offset;
  int32_t iVar4;
  int local_40;
  
  if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    local_40 = 0;
    iVar4 = index;
    while( true ) {
      while( true ) {
        offset = iVar4;
        sVar1 = (this->msg).fUnion.fStackFields.fLengthAndFlags;
        if (sVar1 < 0) {
          iVar3 = (this->msg).fUnion.fFields.fLength;
        }
        else {
          iVar3 = (int)sVar1 >> 5;
        }
        if (iVar3 <= offset) {
          setParseError(this,parseError,0);
          *errorCode = U_UNMATCHED_BRACES;
          return 0;
        }
        iVar4 = offset + 1;
        cVar2 = UnicodeString::doCharAt(&this->msg,offset);
        if (cVar2 == L'\'') break;
        if (cVar2 == L'{') {
          local_40 = local_40 + 1;
        }
        else if (cVar2 == L'}') {
          if (local_40 < 1) {
            if (0xffff < offset - index) {
              setParseError(this,parseError,index);
              *errorCode = U_INDEX_OUTOFBOUNDS_ERROR;
              return 0;
            }
            addPart(this,UMSGPAT_PART_TYPE_ARG_STYLE,index,offset - index,0,errorCode);
            return offset;
          }
          local_40 = local_40 + -1;
        }
      }
      iVar4 = UnicodeString::indexOf(&this->msg,L'\'',iVar4);
      if (iVar4 < 0) break;
      iVar4 = iVar4 + 1;
    }
    setParseError(this,parseError,index);
    *errorCode = U_PATTERN_SYNTAX_ERROR;
  }
  return 0;
}

Assistant:

int32_t
MessagePattern::parseSimpleStyle(int32_t index, UParseError *parseError, UErrorCode &errorCode) {
    if(U_FAILURE(errorCode)) {
        return 0;
    }
    int32_t start=index;
    int32_t nestedBraces=0;
    while(index<msg.length()) {
        UChar c=msg.charAt(index++);
        if(c==u_apos) {
            // Treat apostrophe as quoting but include it in the style part.
            // Find the end of the quoted literal text.
            index=msg.indexOf(u_apos, index);
            if(index<0) {
                // Quoted literal argument style text reaches to the end of the message.
                setParseError(parseError, start);
                errorCode=U_PATTERN_SYNTAX_ERROR;
                return 0;
            }
            // skip the quote-ending apostrophe
            ++index;
        } else if(c==u_leftCurlyBrace) {
            ++nestedBraces;
        } else if(c==u_rightCurlyBrace) {
            if(nestedBraces>0) {
                --nestedBraces;
            } else {
                int32_t length=--index-start;
                if(length>Part::MAX_LENGTH) {
                    setParseError(parseError, start);  // Argument style text too long.
                    errorCode=U_INDEX_OUTOFBOUNDS_ERROR;
                    return 0;
                }
                addPart(UMSGPAT_PART_TYPE_ARG_STYLE, start, length, 0, errorCode);
                return index;
            }
        }  // c is part of literal text
    }
    setParseError(parseError, 0);  // Unmatched '{' braces in message.
    errorCode=U_UNMATCHED_BRACES;
    return 0;
}